

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

ON_Font * __thiscall
ON_FontList::FromWindowsLogfontName
          (ON_FontList *this,wchar_t *windows_logfont_name,Weight prefered_weight,
          Stretch prefered_stretch,Style prefered_style,bool bUnderlined,bool bStrikethrough)

{
  ON_Font *pOVar1;
  
  pOVar1 = FromNames(this,(wchar_t *)0x0,windows_logfont_name,(wchar_t *)0x0,(wchar_t *)0x0,
                     prefered_weight,prefered_stretch,prefered_style,false,false,bUnderlined,
                     bStrikethrough,0.0);
  return pOVar1;
}

Assistant:

const ON_Font* ON_FontList::FromWindowsLogfontName(
  const wchar_t* windows_logfont_name,
  ON_Font::Weight prefered_weight,
  ON_Font::Stretch prefered_stretch,
  ON_Font::Style prefered_style,
  bool bUnderlined,
  bool bStrikethrough
) const
{
  return FromNames(
    nullptr,
    windows_logfont_name,
    nullptr,
    nullptr,
    prefered_weight,
    prefered_stretch,
    prefered_style,
    false,
    false,
    bUnderlined,
    bStrikethrough,
    0.0
  );
}